

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O0

vector<ElementsDecodeRawTransactionTxOutStruct,_std::allocator<ElementsDecodeRawTransactionTxOutStruct>_>
* __thiscall
cfd::core::
JsonObjectVector<cfd::api::json::ElementsDecodeRawTransactionTxOut,_ElementsDecodeRawTransactionTxOutStruct>
::ConvertToStruct(JsonObjectVector<cfd::api::json::ElementsDecodeRawTransactionTxOut,_ElementsDecodeRawTransactionTxOutStruct>
                  *this)

{
  bool bVar1;
  value_type *in_RSI;
  ElementsDecodeRawTransactionTxOutStruct *in_RDI;
  ElementsDecodeRawTransactionTxOutStruct data;
  ElementsDecodeRawTransactionTxOut *element;
  const_iterator __end0;
  const_iterator __begin0;
  JsonObjectVector<cfd::api::json::ElementsDecodeRawTransactionTxOut,_ElementsDecodeRawTransactionTxOutStruct>
  *__range3;
  vector<ElementsDecodeRawTransactionTxOutStruct,_std::allocator<ElementsDecodeRawTransactionTxOutStruct>_>
  *result;
  ElementsDecodeRawTransactionTxOutStruct *this_00;
  vector<ElementsDecodeRawTransactionTxOutStruct,_std::allocator<ElementsDecodeRawTransactionTxOutStruct>_>
  *in_stack_fffffffffffffd50;
  ElementsDecodeRawTransactionTxOut *in_stack_fffffffffffffeb8;
  __normal_iterator<const_cfd::api::json::ElementsDecodeRawTransactionTxOut_*,_std::vector<cfd::api::json::ElementsDecodeRawTransactionTxOut,_std::allocator<cfd::api::json::ElementsDecodeRawTransactionTxOut>_>_>
  local_28 [2];
  undefined1 local_11;
  
  local_11 = 0;
  this_00 = in_RDI;
  std::
  vector<ElementsDecodeRawTransactionTxOutStruct,_std::allocator<ElementsDecodeRawTransactionTxOutStruct>_>
  ::vector((vector<ElementsDecodeRawTransactionTxOutStruct,_std::allocator<ElementsDecodeRawTransactionTxOutStruct>_>
            *)0x4c0c6d);
  local_28[0]._M_current =
       (ElementsDecodeRawTransactionTxOut *)
       std::
       vector<cfd::api::json::ElementsDecodeRawTransactionTxOut,_std::allocator<cfd::api::json::ElementsDecodeRawTransactionTxOut>_>
       ::begin((vector<cfd::api::json::ElementsDecodeRawTransactionTxOut,_std::allocator<cfd::api::json::ElementsDecodeRawTransactionTxOut>_>
                *)in_RDI);
  std::
  vector<cfd::api::json::ElementsDecodeRawTransactionTxOut,_std::allocator<cfd::api::json::ElementsDecodeRawTransactionTxOut>_>
  ::end((vector<cfd::api::json::ElementsDecodeRawTransactionTxOut,_std::allocator<cfd::api::json::ElementsDecodeRawTransactionTxOut>_>
         *)in_RDI);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_cfd::api::json::ElementsDecodeRawTransactionTxOut_*,_std::vector<cfd::api::json::ElementsDecodeRawTransactionTxOut,_std::allocator<cfd::api::json::ElementsDecodeRawTransactionTxOut>_>_>
                             *)this_00,
                            (__normal_iterator<const_cfd::api::json::ElementsDecodeRawTransactionTxOut_*,_std::vector<cfd::api::json::ElementsDecodeRawTransactionTxOut,_std::allocator<cfd::api::json::ElementsDecodeRawTransactionTxOut>_>_>
                             *)in_RDI), bVar1) {
    __gnu_cxx::
    __normal_iterator<const_cfd::api::json::ElementsDecodeRawTransactionTxOut_*,_std::vector<cfd::api::json::ElementsDecodeRawTransactionTxOut,_std::allocator<cfd::api::json::ElementsDecodeRawTransactionTxOut>_>_>
    ::operator*(local_28);
    api::json::ElementsDecodeRawTransactionTxOut::ConvertToStruct(in_stack_fffffffffffffeb8);
    std::
    vector<ElementsDecodeRawTransactionTxOutStruct,_std::allocator<ElementsDecodeRawTransactionTxOutStruct>_>
    ::push_back(in_stack_fffffffffffffd50,in_RSI);
    ElementsDecodeRawTransactionTxOutStruct::~ElementsDecodeRawTransactionTxOutStruct(this_00);
    __gnu_cxx::
    __normal_iterator<const_cfd::api::json::ElementsDecodeRawTransactionTxOut_*,_std::vector<cfd::api::json::ElementsDecodeRawTransactionTxOut,_std::allocator<cfd::api::json::ElementsDecodeRawTransactionTxOut>_>_>
    ::operator++(local_28);
  }
  return (vector<ElementsDecodeRawTransactionTxOutStruct,_std::allocator<ElementsDecodeRawTransactionTxOutStruct>_>
          *)this_00;
}

Assistant:

std::vector<STRUCT_TYPE> ConvertToStruct() const {
    std::vector<STRUCT_TYPE> result;
    for (const auto& element : *this) {
      STRUCT_TYPE data = element.ConvertToStruct();
      result.push_back(data);
    }
    return result;
  }